

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O1

int cbb_add_prefixed_point(CBB *out,EC_GROUP *group,EC_AFFINE *point,int prefix_point)

{
  int iVar1;
  CBB child;
  CBB local_50;
  
  if (prefix_point == 0) {
    iVar1 = point_to_cbb(out,group,point);
    if (iVar1 == 0) {
      return 0;
    }
    iVar1 = CBB_flush(out);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = CBB_add_u16_length_prefixed(out,&local_50);
    if (((iVar1 == 0) || (iVar1 = point_to_cbb(&local_50,group,point), iVar1 == 0)) ||
       (iVar1 = CBB_flush(out), iVar1 == 0)) {
      return 0;
    }
  }
  return 1;
}

Assistant:

static int cbb_add_prefixed_point(CBB *out, const EC_GROUP *group,
                                  const EC_AFFINE *point, int prefix_point) {
  if (prefix_point) {
    CBB child;
    if (!CBB_add_u16_length_prefixed(out, &child) ||
        !point_to_cbb(&child, group, point) || !CBB_flush(out)) {
      return 0;
    }
  } else {
    if (!point_to_cbb(out, group, point) || !CBB_flush(out)) {
      return 0;
    }
  }

  return 1;
}